

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O0

void __thiscall soul::heart::Parser::scanNextTopLevelItem(Parser *this,ScannedTopLevelItem *item)

{
  bool bVar1;
  Module *pMVar2;
  CompileMessage local_50;
  ScannedTopLevelItem *local_18;
  ScannedTopLevelItem *item_local;
  Parser *this_local;
  
  local_18 = item;
  item_local = (ScannedTopLevelItem *)this;
  pMVar2 = pool_ptr<soul::Module>::operator->(&this->module);
  bVar1 = Module::isGraph(pMVar2);
  if (!bVar1) {
    pMVar2 = pool_ptr<soul::Module>::operator->(&this->module);
    bVar1 = Module::isProcessor(pMVar2);
    if (!bVar1) goto LAB_004bc910;
  }
  bVar1 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
          ::matchIf<char_const*>
                    ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                      *)this,"input");
  if (bVar1) {
    scanInput(this,local_18);
    return;
  }
  bVar1 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
          ::matchIf<char_const*>
                    ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                      *)this,"output");
  if (bVar1) {
    scanOutput(this,local_18);
    return;
  }
LAB_004bc910:
  pMVar2 = pool_ptr<soul::Module>::operator->(&this->module);
  bVar1 = Module::isGraph(pMVar2);
  if (bVar1) {
    bVar1 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
            ::matchIf<char_const*>
                      ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                        *)this,"node");
    if (bVar1) {
      parseNode(this);
      return;
    }
    bVar1 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
            ::matchIf<char_const*>
                      ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                        *)this,"connection");
    if (bVar1) {
      parseConnection(this);
      return;
    }
  }
  else {
    bVar1 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
            ::matchIf<char_const*>
                      ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                        *)this,"struct");
    if (bVar1) {
      scanStruct(this,local_18);
      return;
    }
    bVar1 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
            ::matchIf<char_const*>
                      ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                        *)this,"function");
    if (bVar1) {
      scanFunction(this,local_18,false);
      return;
    }
    bVar1 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
            ::matchIf<char_const*>
                      ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                        *)this,"var");
    if (bVar1) {
      scanStateVariable(this,local_18,false);
      return;
    }
    pMVar2 = pool_ptr<soul::Module>::operator->(&this->module);
    bVar1 = Module::isProcessor(pMVar2);
    if (bVar1) {
      bVar1 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
              ::matchIf<char_const*>
                        ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                          *)this,"event");
      if (bVar1) {
        scanFunction(this,local_18,true);
        return;
      }
      bVar1 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
              ::matchIf<char_const*>
                        ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                          *)this,"processor");
      if (bVar1) {
        parseLatency(this);
        return;
      }
    }
  }
  bVar1 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
          ::matchIf<char_const*>
                    ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                      *)this,"let");
  if (bVar1) {
    scanStateVariable(this,local_18,true);
  }
  else {
    Errors::expectedTopLevelDecl<>();
    (*(this->
      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
      )._vptr_Tokeniser[2])(this,&local_50);
    CompileMessage::~CompileMessage(&local_50);
  }
  return;
}

Assistant:

void scanNextTopLevelItem (ScannedTopLevelItem& item)
    {
        if (module->isGraph() || module->isProcessor())
        {
            if (matchIf ("input"))       return scanInput (item);
            if (matchIf ("output"))      return scanOutput (item);
        }

        if (module->isGraph())
        {
            if (matchIf ("node"))        return parseNode();
            if (matchIf ("connection"))  return parseConnection();
        }
        else
        {
            if (matchIf ("struct"))      return scanStruct (item);
            if (matchIf ("function"))    return scanFunction (item, false);
            if (matchIf ("var"))         return scanStateVariable (item, false);

            if (module->isProcessor())
            {
                if (matchIf ("event"))       return scanFunction (item, true);
                if (matchIf ("processor"))   return parseLatency();
            }
        }

        if (matchIf ("let"))
            return scanStateVariable (item, true);

        throwError (Errors::expectedTopLevelDecl());
    }